

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O1

void __thiscall setup::run_entry::load(run_entry *this,istream *is,info *i)

{
  bitset<256UL> *lead_bytes;
  uint uVar1;
  log_level lVar2;
  wait_condition wVar3;
  logger *plVar4;
  char buffer_3 [1];
  stored_flag_reader<flags<setup::run_entry::flags_Enum_,_12UL>_> flagreader;
  undefined1 local_1a9;
  undefined1 local_1a8 [16];
  size_t local_198;
  stored_type local_190;
  _Base_bitset<1UL> local_188;
  size_t sStack_180;
  
  if ((i->version).value < 0x1030000) {
    std::istream::read((char *)is,(long)local_1a8);
  }
  lead_bytes = &(i->header).lead_bytes;
  util::encoded_string::load(is,&this->name,i->codepage,lead_bytes);
  util::encoded_string::load(is,&this->parameters,i->codepage,lead_bytes);
  util::encoded_string::load(is,&this->working_dir,i->codepage,lead_bytes);
  if ((i->version).value < 0x1030900) {
    (this->run_once_id)._M_string_length = 0;
    *(this->run_once_id)._M_dataplus._M_p = '\0';
  }
  else {
    util::encoded_string::load(is,&this->run_once_id,i->codepage,(bitset<256UL> *)0x0);
  }
  if ((i->version).value < 0x2000200) {
    (this->status_message)._M_string_length = 0;
    *(this->status_message)._M_dataplus._M_p = '\0';
  }
  else {
    util::encoded_string::load(is,&this->status_message,i->codepage,(bitset<256UL> *)0x0);
  }
  if ((i->version).value < 0x5010d00) {
    (this->verb)._M_string_length = 0;
    *(this->verb)._M_dataplus._M_p = '\0';
  }
  else {
    util::encoded_string::load(is,&this->verb,i->codepage,(bitset<256UL> *)0x0);
  }
  if ((0x1ffffff < (i->version).value) ||
     (((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 4) != 0)) {
    util::encoded_string::load(is,&this->description,i->codepage,(bitset<256UL> *)0x0);
  }
  item::load_condition_data(&this->super_item,is,i);
  windows_version_range::load(&(this->super_item).winver,is,&i->version);
  lVar2 = Debug;
  if (0x10317ff < (i->version).value) {
    std::istream::read((char *)is,(long)local_1a8);
    lVar2 = local_1a8._0_4_;
  }
  this->show_command = lVar2;
  std::istream::read((char *)is,(long)local_1a8);
  if ((local_1a8._0_8_ & 0xff) < 3) {
    wVar3 = *(wait_condition *)
             ((anonymous_namespace)::stored_run_wait_condition::values +
             (local_1a8._0_8_ & 0xff) * 4);
  }
  else {
    local_1a8._0_4_ = Warning;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1a8 + 8),"Unexpected ",0xb)
    ;
    plVar4 = logger::operator<<((logger *)local_1a8,
                                &enum_names<setup::run_entry::wait_condition>::name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&plVar4->buffer," value: ",8);
    std::ostream::_M_insert<unsigned_long>((ulong)&plVar4->buffer);
    logger::~logger((logger *)local_1a8);
    wVar3 = WaitUntilTerminated;
  }
  this->wait = wVar3;
  local_1a8._0_8_ =
       (ulong)(((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 1) == 0) * 0x10 + 0x10;
  local_198 = 0;
  local_190 = '\0';
  local_188._M_w = 0;
  sStack_180 = 0;
  local_1a8._8_8_ = is;
  if (0x10202ff < (i->version).value) {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,VersionInfoValid);
  }
  uVar1 = (i->version).value;
  if ((0x10308ff < uVar1) ||
     ((0x10307ff < uVar1 && (((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 4) != 0))))
  {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,VersionInfoNotValid);
  }
  if (0x1ffffff < (i->version).value) {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,TimeStampInUTC);
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,IsUninstallerExe);
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,
               CallInstructionOptimized);
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,Touch);
  }
  if (0x20007ff < (i->version).value) {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,ChunkEncrypted);
  }
  if (0x50109ff < (i->version).value) {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,ChunkCompressed);
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,SolidBreak);
  }
  if (0x501ffff < (i->version).value) {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,Sign);
  }
  if (0x600ffff < (i->version).value) {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,SignOnce);
  }
  if (0x602ffff < (i->version).value) {
    stored_flag_reader<setup::data_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::data_entry::flags_Enum_> *)local_1a8,BZipped);
  }
  if ((sStack_180 == 3) && (local_1a8._0_8_ == 0x20)) {
    std::istream::read((char *)local_1a8._8_8_,(long)&local_1a9);
  }
  (this->options)._flags.super__Base_bitset<1UL>._M_w = local_188._M_w;
  return;
}

Assistant:

void run_entry::load(std::istream & is, const info & i) {
	
	if(i.version < INNO_VERSION(1, 3, 0)) {
		(void)util::load<boost::uint32_t>(is); // uncompressed size of the entry
	}
	
	is >> util::encoded_string(name, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(parameters, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(working_dir, i.codepage, i.header.lead_bytes);
	if(i.version >= INNO_VERSION(1, 3, 9)) {
		is >> util::encoded_string(run_once_id, i.codepage);
	} else {
		run_once_id.clear();
	}
	if(i.version >= INNO_VERSION(2, 0, 2)) {
		is >> util::encoded_string(status_message, i.codepage);
	} else {
		status_message.clear();
	}
	if(i.version >= INNO_VERSION(5, 1, 13)) {
		is >> util::encoded_string(verb, i.codepage);
	} else {
		verb.clear();
	}
	if(i.version >= INNO_VERSION(2, 0, 0) || i.version.is_isx()) {
		is >> util::encoded_string(description, i.codepage);
	}
	
	load_condition_data(is, i);
	
	load_version_data(is, i.version);
	
	if(i.version >= INNO_VERSION(1, 3, 24)) {
		show_command = util::load<boost::int32_t>(is);
	} else {
		show_command = 0;
	}
	
	wait = stored_enum<stored_run_wait_condition>(is).get();
	
	stored_flag_reader<flags> flagreader(is, i.version.bits());
	
	if(i.version >= INNO_VERSION(1, 2, 3)) {
		flagreader.add(ShellExec);
	}
	if(i.version >= INNO_VERSION(1, 3, 9) || (i.version.is_isx() && i.version >= INNO_VERSION(1, 3, 8))) {
		flagreader.add(SkipIfDoesntExist);
	}
	if(i.version >= INNO_VERSION(2, 0, 0)) {
		flagreader.add(PostInstall);
		flagreader.add(Unchecked);
		flagreader.add(SkipIfSilent);
		flagreader.add(SkipIfNotSilent);
	}
	if(i.version >= INNO_VERSION(2, 0, 8)) {
		flagreader.add(HideWizard);
	}
	if(i.version >= INNO_VERSION(5, 1, 10)) {
		flagreader.add(Bits32);
		flagreader.add(Bits64);
	}
	if(i.version >= INNO_VERSION(5, 2, 0)) {
		flagreader.add(RunAsOriginalUser);
	}
	if(i.version >= INNO_VERSION(6, 1, 0)) {
		flagreader.add(DontLogParameters);
	}
	if(i.version >= INNO_VERSION(6, 3, 0)) {
		flagreader.add(LogOutput);
	}
	
	options = flagreader.finalize();
}